

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

AddSocketOptionFunc *
brynet::net::TcpService::AddSocketOption::WithEnterCallback
          (AddSocketOptionFunc *__return_storage_ptr__,ENTER_CALLBACK *callback)

{
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  ENTER_CALLBACK *local_18;
  ENTER_CALLBACK *callback_local;
  
  local_18 = callback;
  callback_local = (ENTER_CALLBACK *)__return_storage_ptr__;
  std::
  function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_38,callback);
  std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>::
  function<brynet::net::TcpService::AddSocketOption::WithEnterCallback(std::function<void(long,std::__cxx11::string_const&)>)::__0,void>
            ((function<void(brynet::net::TcpService::AddSocketOption::Options&)> *)
             __return_storage_ptr__,(anon_class_32_1_dda845c3 *)&local_38);
  WithEnterCallback(std::function<void(long,std::__cxx11::string_const&)>)::$_0::~__0
            ((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

TcpService::AddSocketOption::AddSocketOptionFunc TcpService::AddSocketOption::WithEnterCallback(TcpService::ENTER_CALLBACK callback)
{
    return [=](TcpService::AddSocketOption::Options& option) {
        option.enterCallback = callback;
    };
}